

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  acutest_test_data_ *paVar7;
  char *local_50;
  char *str_state;
  acutest_test_data_ *details;
  char *suite_name;
  int n_failed;
  int n_success;
  int n_run;
  acutest_state_ if_unselected;
  acutest_state_ if_selected;
  int exit_code;
  int index;
  int i;
  char **argv_local;
  int argc_local;
  
  if_unselected = ACUTEST_STATE_FAILED;
  acutest_argv0_ = *argv;
  acutest_colorize_ = isatty(1);
  acutest_list_size_ = 0;
  exit_code = 0;
  while (acutest_list_[exit_code].func != (_func_void *)0x0) {
    acutest_list_size_ = acutest_list_size_ + 1;
    exit_code = exit_code + 1;
  }
  acutest_test_data_ = (acutest_test_data_ *)calloc((long)acutest_list_size_,0x10);
  if (acutest_test_data_ == (acutest_test_data_ *)0x0) {
    fprintf(_stderr,"Out of memory.\n");
    acutest_exit_(2);
  }
  acutest_cmdline_read_(acutest_cmdline_options_,argc,argv,acutest_cmdline_callback_);
  acutest_timer_init_();
  iVar1 = acutest_count_(ACUTEST_STATE_SELECTED);
  if (iVar1 < 1) {
    exit_code = 0;
    while (acutest_list_[exit_code].func != (_func_void *)0x0) {
      acutest_test_data_[exit_code].state = ACUTEST_STATE_NEEDTORUN;
      exit_code = exit_code + 1;
    }
  }
  else {
    if (acutest_exclude_mode_ == 0) {
      n_run = -2;
      n_success = -1;
    }
    else {
      n_run = -1;
      n_success = -2;
    }
    exit_code = 0;
    while (acutest_list_[exit_code].func != (_func_void *)0x0) {
      if (acutest_test_data_[exit_code].state == ACUTEST_STATE_SELECTED) {
        acutest_test_data_[exit_code].state = n_run;
      }
      else {
        acutest_test_data_[exit_code].state = n_success;
      }
      exit_code = exit_code + 1;
    }
  }
  if (acutest_no_exec_ < 0) {
    iVar1 = acutest_count_(ACUTEST_STATE_NEEDTORUN);
    if ((iVar1 < 2) || (iVar1 = acutest_under_debugger_(), iVar1 != 0)) {
      acutest_no_exec_ = 1;
    }
    else {
      acutest_no_exec_ = 0;
    }
  }
  if (acutest_tap_ != 0) {
    if (2 < acutest_verbose_level_) {
      acutest_verbose_level_ = 2;
    }
    acutest_no_summary_ = 1;
    if (acutest_worker_ == 0) {
      uVar2 = acutest_count_(ACUTEST_STATE_NEEDTORUN);
      printf("1..%d\n",(ulong)uVar2);
    }
  }
  if_selected = acutest_worker_index_;
  exit_code = 0;
  while (iVar1 = acutest_list_size_, acutest_list_[exit_code].func != (_func_void *)0x0) {
    if (acutest_test_data_[exit_code].state == ACUTEST_STATE_NEEDTORUN) {
      acutest_run_(acutest_list_ + exit_code,if_selected,exit_code);
      if_selected = if_selected + ACUTEST_STATE_FAILED;
    }
    exit_code = exit_code + 1;
  }
  if ((acutest_no_summary_ == 0) && (0 < acutest_verbose_level_)) {
    iVar3 = acutest_count_(ACUTEST_STATE_EXCLUDED);
    uVar2 = acutest_count_(ACUTEST_STATE_SUCCESS);
    uVar4 = acutest_count_(ACUTEST_STATE_FAILED);
    if (2 < acutest_verbose_level_) {
      acutest_colored_printf_(10,"Summary:\n");
      printf("  Count of run unit tests:        %4d\n",(ulong)(uint)(iVar1 - iVar3));
      printf("  Count of successful unit tests: %4d\n",(ulong)uVar2);
      printf("  Count of failed unit tests:     %4d\n",(ulong)uVar4);
    }
    if (uVar4 == 0) {
      acutest_colored_printf_(0xc,"SUCCESS:");
      printf(" No unit tests have failed.\n");
    }
    else {
      acutest_colored_printf_(0xb,"FAILED:");
      pcVar6 = "have";
      if (uVar4 == 1) {
        pcVar6 = "has";
      }
      printf(" %d of %d unit tests %s failed.\n",(ulong)uVar4,(ulong)(uint)(iVar1 - iVar3),pcVar6);
    }
    if (2 < acutest_verbose_level_) {
      printf("\n");
    }
  }
  if (acutest_xml_output_ != (FILE *)0x0) {
    pcVar6 = acutest_basename_(*argv);
    fprintf((FILE *)acutest_xml_output_,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
    __stream = acutest_xml_output_;
    iVar1 = acutest_list_size_;
    uVar2 = acutest_count_(ACUTEST_STATE_FAILED);
    iVar3 = acutest_count_(ACUTEST_STATE_SKIPPED);
    iVar5 = acutest_count_(ACUTEST_STATE_EXCLUDED);
    fprintf((FILE *)__stream,
            "<testsuite name=\"%s\" tests=\"%d\" errors=\"0\" failures=\"%d\" skip=\"%d\">\n",pcVar6
            ,(ulong)(uint)iVar1,(ulong)uVar2,(ulong)(uint)(iVar3 + iVar5));
    exit_code = 0;
    while (acutest_list_[exit_code].func != (_func_void *)0x0) {
      paVar7 = acutest_test_data_ + exit_code;
      fprintf((FILE *)acutest_xml_output_,"  <testcase name=\"%s\" time=\"%.2f\">\n",
              paVar7->duration,acutest_list_[exit_code].name);
      switch(paVar7->state) {
      case ACUTEST_STATE_SUCCESS:
        local_50 = (char *)0x0;
        break;
      case ACUTEST_STATE_FAILED:
      default:
        local_50 = "<failure />";
        break;
      case ACUTEST_STATE_EXCLUDED:
      case ACUTEST_STATE_SKIPPED:
        local_50 = "<skipped />";
      }
      if (local_50 != (char *)0x0) {
        fprintf((FILE *)acutest_xml_output_,"    %s\n",local_50);
      }
      fprintf((FILE *)acutest_xml_output_,"  </testcase>\n");
      exit_code = exit_code + 1;
    }
    fprintf((FILE *)acutest_xml_output_,"</testsuite>\n");
    fclose((FILE *)acutest_xml_output_);
  }
  if ((acutest_worker_ == 0) ||
     (iVar1 = acutest_count_(ACUTEST_STATE_EXCLUDED), iVar1 + 1 != acutest_list_size_)) {
    iVar1 = acutest_count_(ACUTEST_STATE_FAILED);
    if_unselected = (acutest_state_)(0 < iVar1);
  }
  else {
    exit_code = 0;
    while (acutest_list_[exit_code].func != (_func_void *)0x0) {
      if (acutest_test_data_[exit_code].state != ACUTEST_STATE_EXCLUDED) {
        if_unselected = acutest_test_data_[exit_code].state;
        break;
      }
      exit_code = exit_code + 1;
    }
  }
  acutest_cleanup_();
  return if_unselected;
}

Assistant:

int
main(int argc, char** argv)
{
    int i, index;
    int exit_code = 1;

    acutest_argv0_ = argv[0];

#if defined ACUTEST_UNIX_
    acutest_colorize_ = isatty(STDOUT_FILENO);
#elif defined ACUTEST_WIN_
 #if defined _BORLANDC_
    acutest_colorize_ = isatty(_fileno(stdout));
 #else
    acutest_colorize_ = _isatty(_fileno(stdout));
 #endif
#else
    acutest_colorize_ = 0;
#endif

    /* Count all test units */
    acutest_list_size_ = 0;
    for(i = 0; acutest_list_[i].func != NULL; i++)
        acutest_list_size_++;

    acutest_test_data_ = (struct acutest_test_data_*)calloc(acutest_list_size_, sizeof(struct acutest_test_data_));
    if(acutest_test_data_ == NULL) {
        fprintf(stderr, "Out of memory.\n");
        acutest_exit_(2);
    }

    /* Parse options */
    acutest_cmdline_read_(acutest_cmdline_options_, argc, argv, acutest_cmdline_callback_);

    /* Initialize the proper timer. */
    acutest_timer_init_();

#if defined(ACUTEST_WIN_)
    SetUnhandledExceptionFilter(acutest_seh_exception_filter_);
#ifdef _MSC_VER
    _set_abort_behavior(0, _WRITE_ABORT_MSG);
#endif
#endif

    /* Determine what to run. */
    if(acutest_count_(ACUTEST_STATE_SELECTED) > 0) {
        enum acutest_state_ if_selected;
        enum acutest_state_ if_unselected;

        if(!acutest_exclude_mode_) {
            if_selected = ACUTEST_STATE_NEEDTORUN;
            if_unselected = ACUTEST_STATE_EXCLUDED;
        } else {
            if_selected = ACUTEST_STATE_EXCLUDED;
            if_unselected = ACUTEST_STATE_NEEDTORUN;
        }

        for(i = 0; acutest_list_[i].func != NULL; i++) {
            if(acutest_test_data_[i].state == ACUTEST_STATE_SELECTED)
                acutest_test_data_[i].state = if_selected;
            else
                acutest_test_data_[i].state = if_unselected;
        }
    } else {
        /* By default, we want to run all tests. */
        for(i = 0; acutest_list_[i].func != NULL; i++)
            acutest_test_data_[i].state = ACUTEST_STATE_NEEDTORUN;
    }

    /* By default, we want to suppress running tests as child processes if we
     * run just one test, or if we're under debugger: Debugging tests is then
     * so much easier. */
    if(acutest_no_exec_ < 0) {
        if(acutest_count_(ACUTEST_STATE_NEEDTORUN) <= 1  ||  acutest_under_debugger_())
            acutest_no_exec_ = 1;
        else
            acutest_no_exec_ = 0;
    }

    if(acutest_tap_) {
        /* TAP requires we know test result ("ok", "not ok") before we output
         * anything about the test, and this gets problematic for larger verbose
         * levels. */
        if(acutest_verbose_level_ > 2)
            acutest_verbose_level_ = 2;

        /* TAP harness should provide some summary. */
        acutest_no_summary_ = 1;

        if(!acutest_worker_)
            printf("1..%d\n", acutest_count_(ACUTEST_STATE_NEEDTORUN));
    }

    index = acutest_worker_index_;
    for(i = 0; acutest_list_[i].func != NULL; i++) {
        if(acutest_test_data_[i].state == ACUTEST_STATE_NEEDTORUN)
            acutest_run_(&acutest_list_[i], index++, i);
    }

    /* Write a summary */
    if(!acutest_no_summary_ && acutest_verbose_level_ >= 1) {
        int n_run, n_success, n_failed ;

        n_run = acutest_list_size_ - acutest_count_(ACUTEST_STATE_EXCLUDED);
        n_success = acutest_count_(ACUTEST_STATE_SUCCESS);
        n_failed = acutest_count_(ACUTEST_STATE_FAILED);

        if(acutest_verbose_level_ >= 3) {
            acutest_colored_printf_(ACUTEST_COLOR_DEFAULT_INTENSIVE_, "Summary:\n");

            printf("  Count of run unit tests:        %4d\n", n_run);
            printf("  Count of successful unit tests: %4d\n", n_success);
            printf("  Count of failed unit tests:     %4d\n", n_failed);
        }

        if(n_failed == 0) {
            acutest_colored_printf_(ACUTEST_COLOR_GREEN_INTENSIVE_, "SUCCESS:");
            printf(" No unit tests have failed.\n");
        } else {
            acutest_colored_printf_(ACUTEST_COLOR_RED_INTENSIVE_, "FAILED:");
            printf(" %d of %d unit tests %s failed.\n",
                    n_failed, n_run, (n_failed == 1) ? "has" : "have");
        }

        if(acutest_verbose_level_ >= 3)
            printf("\n");
    }

    if (acutest_xml_output_) {
        const char* suite_name = acutest_basename_(argv[0]);
        fprintf(acutest_xml_output_, "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
        fprintf(acutest_xml_output_, "<testsuite name=\"%s\" tests=\"%d\" errors=\"0\" failures=\"%d\" skip=\"%d\">\n",
            suite_name,
            (int)acutest_list_size_,
            acutest_count_(ACUTEST_STATE_FAILED),
            acutest_count_(ACUTEST_STATE_SKIPPED) + acutest_count_(ACUTEST_STATE_EXCLUDED));
        for(i = 0; acutest_list_[i].func != NULL; i++) {
            struct acutest_test_data_ *details = &acutest_test_data_[i];
            const char* str_state;
            fprintf(acutest_xml_output_, "  <testcase name=\"%s\" time=\"%.2f\">\n", acutest_list_[i].name, details->duration);

            switch(details->state) {
                case ACUTEST_STATE_SUCCESS:     str_state = NULL; break;
                case ACUTEST_STATE_EXCLUDED:    /* Fall through. */
                case ACUTEST_STATE_SKIPPED:     str_state = "<skipped />"; break;
                case ACUTEST_STATE_FAILED:      /* Fall through. */
                default:                        str_state = "<failure />"; break;
            }

            if(str_state != NULL)
                fprintf(acutest_xml_output_, "    %s\n", str_state);
            fprintf(acutest_xml_output_, "  </testcase>\n");
        }
        fprintf(acutest_xml_output_, "</testsuite>\n");
        fclose(acutest_xml_output_);
    }

    if(acutest_worker_  &&  acutest_count_(ACUTEST_STATE_EXCLUDED)+1 == acutest_list_size_) {
        /* If we are the child process, we need to propagate the test state
         * without any moderation. */
        for(i = 0; acutest_list_[i].func != NULL; i++) {
            if(acutest_test_data_[i].state != ACUTEST_STATE_EXCLUDED) {
                exit_code = (int) acutest_test_data_[i].state;
                break;
            }
        }
    } else {
        if(acutest_count_(ACUTEST_STATE_FAILED) > 0)
            exit_code = 1;
        else
            exit_code = 0;
    }

    acutest_cleanup_();
    return exit_code;
}